

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_bbdpre.c
# Opt level: O0

int KINBBDPrecFree(KINMem kin_mem)

{
  void *__ptr;
  long in_RDI;
  KBBDPrecData pdata;
  KINLsMem kinls_mem;
  
  if ((*(long *)(in_RDI + 0x248) != 0) && (*(long *)(*(long *)(in_RDI + 0x248) + 0x90) != 0)) {
    __ptr = *(void **)(*(long *)(in_RDI + 0x248) + 0x90);
    SUNLinSolFree(*(undefined8 *)((long)__ptr + 0x48));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x58));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x50));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x60));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x68));
    N_VDestroy(*(undefined8 *)((long)__ptr + 0x70));
    SUNMatDestroy(*(undefined8 *)((long)__ptr + 0x40));
    free(__ptr);
  }
  return 0;
}

Assistant:

static int KINBBDPrecFree(KINMem kin_mem)
{
  KINLsMem kinls_mem;
  KBBDPrecData pdata;

  if (kin_mem->kin_lmem == NULL) { return (0); }
  kinls_mem = (KINLsMem)kin_mem->kin_lmem;

  if (kinls_mem->pdata == NULL) { return (0); }
  pdata = (KBBDPrecData)kinls_mem->pdata;

  SUNLinSolFree(pdata->LS);
  N_VDestroy(pdata->zlocal);
  N_VDestroy(pdata->rlocal);
  N_VDestroy(pdata->tempv1);
  N_VDestroy(pdata->tempv2);
  N_VDestroy(pdata->tempv3);
  SUNMatDestroy(pdata->PP);

  free(pdata);
  pdata = NULL;

  return (0);
}